

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

cali_variant_t cali_get(cali_id_t attr_id)

{
  bool bVar1;
  cali_variant_t cVar2;
  Attribute local_80;
  Entry local_78;
  cali_variant_t local_60;
  undefined4 local_50;
  undefined1 local_40 [8];
  Caliper c;
  cali_id_t attr_id_local;
  
  c._24_8_ = attr_id;
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool((Caliper *)local_40);
  if (bVar1) {
    local_80 = cali::Caliper::get_attribute((Caliper *)local_40,c._24_8_);
    cali::Caliper::get(&local_78,(Caliper *)local_40,&local_80);
    local_60 = (cali_variant_t)cali::Entry::value(&local_78);
    cVar2 = cali::Variant::c_variant((Variant *)&local_60);
  }
  else {
    cVar2 = cali_make_empty_variant();
  }
  local_50 = 1;
  cali::Caliper::~Caliper((Caliper *)local_40);
  return cVar2;
}

Assistant:

cali_variant_t cali_get(cali_id_t attr_id)
{
    Caliper c = Caliper::sigsafe_instance();

    if (!c)
        return cali_make_empty_variant();

    return c.get(c.get_attribute(attr_id)).value().c_variant();
}